

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_nmi_triggered_when_enabled_during_vblank_Test::TestBody
          (PpuTest_nmi_triggered_when_enabled_during_vblank_Test *this)

{
  IPpu *pIVar1;
  int iVar2;
  char *in_R9;
  bool triggered;
  AssertionResult gtest_ar_;
  internal local_59;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_38 [16];
  code *local_28;
  code *pcStack_20;
  
  local_38._0_8_ = &local_59;
  local_59 = (internal)0x0;
  (this->super_PpuTest).expected.ctrl.value_ = 0x80;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp:181:26)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp:181:26)>
             ::_M_manager;
  (*((this->super_PpuTest).ppu._M_t.
     super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
     super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
     super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[5])();
  if (local_28 != (code *)0x0) {
    (*local_28)(local_38,local_38,3);
  }
  iVar2 = 0x14106;
  do {
    (*((this->super_PpuTest).ppu._M_t.
       super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
       super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_48[0] = (internal)((byte)local_59 ^ 1);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_59 == (internal)0x0) {
    (*((this->super_PpuTest).ppu._M_t.
       super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
       super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl)->_vptr_IPpu[4])();
    local_48[0] = (internal)((byte)local_59 ^ 1);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_59 == (internal)0x0) {
      pIVar1 = (this->super_PpuTest).ppu._M_t.
               super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>.
               _M_t.
               super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
               super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
      (*pIVar1->_vptr_IPpu[3])(pIVar1,0x2000,0x80);
      local_48[0] = local_59;
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_59 == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_38,local_48,(AssertionResult *)"triggered","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0xbf,(char *)local_38._0_8_);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      }
      else {
        local_59 = (internal)0x0;
        pIVar1 = (this->super_PpuTest).ppu._M_t.
                 super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>
                 .super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
        (*pIVar1->_vptr_IPpu[3])(pIVar1,0x2000,0x80);
        local_48[0] = (internal)((byte)local_59 ^ 1);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_59 == (internal)0x0) goto LAB_001bf7f8;
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_38,local_48,(AssertionResult *)"triggered","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                   ,0xc5,(char *)local_38._0_8_);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      }
    }
    else {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_38,local_48,(AssertionResult *)"triggered","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
                 ,0xbb,(char *)local_38._0_8_);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    }
  }
  else {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_38,local_48,(AssertionResult *)"triggered","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_ppu.cpp"
               ,0xb8,(char *)local_38._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((internal *)local_38._0_8_ != (internal *)&local_28) {
    operator_delete((void *)local_38._0_8_,(ulong)((long)local_28 + 1));
  }
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_001bf7f8:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST_F(PpuTest, nmi_triggered_when_enabled_during_vblank) {
    bool triggered = false;
    expected.ctrl = PpuCtrl(0b1000'0000);
    ppu->set_nmi_handler([&] { triggered = true; });

    step_execution(kCyclesPerScanline * 241 + 1);
    ASSERT_FALSE(triggered);

    step_execution(1);
    ASSERT_FALSE(triggered);

    // Trigger nmi by enabling it during vblank.
    ppu->write_byte(0x2000, 0b1000'0000);
    ASSERT_TRUE(triggered);

    triggered = false;

    // Nmi should only be triggered when the bit goes from 0 to 1.
    ppu->write_byte(0x2000, 0b1000'0000);
    ASSERT_FALSE(triggered);
}